

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_param.c
# Opt level: O3

int param_get_com(int cs,double *resdata,SpurUserParamsPtr spur)

{
  int iVar1;
  double *pdVar2;
  
  iVar1 = 0;
  if ((uint)cs < 0x49) {
    pdVar2 = pp(cs,MOTOR_RIGHT);
    *resdata = *pdVar2;
    pdVar2 = pp(cs,MOTOR_LEFT);
    resdata[1] = *pdVar2;
    iVar1 = cs;
  }
  return iVar1;
}

Assistant:

int param_get_com(int cs, double* resdata, SpurUserParamsPtr spur)
{
  if (cs >= 0 && cs < YP_PARAM_NUM)
  {
    resdata[0] = *pp(cs, 0);
    resdata[1] = *pp(cs, 1);
    return cs;
  }
  else
  {
    return 0;
  }
}